

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

bool testing::internal::TuplePrefix<2ul>::
     Matches<std::tuple<testing::Matcher<TestFunction>,testing::Matcher<int>>,std::tuple<TestFunction,int>>
               (tuple<testing::Matcher<TestFunction>,_testing::Matcher<int>_> *matcher_tuple,
               tuple<TestFunction,_int> *value_tuple)

{
  bool bVar1;
  tuple<testing::Matcher<TestFunction>,_testing::Matcher<int>_> *in_RSI;
  int in_stack_0000000c;
  MatcherBase<int> *in_stack_00000010;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  bool bVar2;
  
  bVar1 = TuplePrefix<1ul>::
          Matches<std::tuple<testing::Matcher<TestFunction>,testing::Matcher<int>>,std::tuple<TestFunction,int>>
                    (in_RSI,(tuple<TestFunction,_int> *)
                            CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
  bVar2 = false;
  if (bVar1) {
    std::get<1ul,testing::Matcher<TestFunction>,testing::Matcher<int>>
              ((tuple<testing::Matcher<TestFunction>,_testing::Matcher<int>_> *)0x1c7ab6);
    std::get<1ul,TestFunction,int>((tuple<TestFunction,_int> *)0x1c7ac5);
    bVar2 = MatcherBase<int>::Matches(in_stack_00000010,in_stack_0000000c);
  }
  return bVar2;
}

Assistant:

static bool Matches(const MatcherTuple& matcher_tuple,
                      const ValueTuple& value_tuple) {
    using ::std::tr1::get;
    return TuplePrefix<N - 1>::Matches(matcher_tuple, value_tuple)
        && get<N - 1>(matcher_tuple).Matches(get<N - 1>(value_tuple));
  }